

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_lua.c
# Opt level: O2

int luv_buffer_new(lua_State *L)

{
  lua_Integer lVar1;
  undefined4 *puVar2;
  void *pvVar3;
  uv_mutex_t *mutex;
  int iVar4;
  
  lVar1 = luaL_optinteger(L,1,0x20000);
  puVar2 = (undefined4 *)lua_newuserdata(L,0x30);
  lua_getfield(L,-0xf4628,"luv_buffer_t");
  lua_setmetatable(L,-2);
  if (puVar2 != (undefined4 *)0x0) {
    *(undefined8 *)(puVar2 + 2) = 0;
    *(undefined8 *)(puVar2 + 4) = 0x100000000;
    *(undefined8 *)(puVar2 + 6) = 1;
    *(undefined8 *)(puVar2 + 8) = 0;
    *puVar2 = 100;
    iVar4 = (int)lVar1;
    if (0 < iVar4) {
      pvVar3 = malloc((ulong)(iVar4 + 2));
      *(void **)(puVar2 + 2) = pvVar3;
      puVar2[4] = iVar4;
    }
    mutex = (uv_mutex_t *)malloc(0x28);
    *(uv_mutex_t **)(puVar2 + 10) = mutex;
    uv_mutex_init(mutex);
  }
  return 1;
}

Assistant:

static int luv_buffer_new(lua_State* L)
{
	lua_Integer length = luaL_optinteger(L, 1, 128 * 1024);

	luv_buffer_t* buffer = NULL;
	buffer = lua_newuserdata(L, sizeof(*buffer));
	luaL_getmetatable(L, LUV_BUFFER);
	lua_setmetatable(L, -2);

	buffer_init(buffer, length);

	return 1;
}